

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Vec_Ptr_t * Aig_ManSupportsInverse(Aig_Man_t *p)

{
  int Entry;
  int i;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Int_t *pVVar1;
  Vec_Int_t *p_02;
  int iVar2;
  int i_00;
  int i_01;
  
  p_00 = Aig_ManSupports(p);
  p_01 = Vec_PtrAlloc(p->nObjs[2]);
  for (iVar2 = 0; iVar2 < p->nObjs[2]; iVar2 = iVar2 + 1) {
    pVVar1 = Vec_IntAlloc(8);
    Vec_PtrPush(p_01,pVVar1);
  }
  i_00 = 0;
  iVar2 = p_00->nSize;
  if (p_00->nSize < 1) {
    iVar2 = i_00;
  }
  for (; i_00 != iVar2; i_00 = i_00 + 1) {
    pVVar1 = (Vec_Int_t *)Vec_PtrEntry(p_00,i_00);
    Entry = Vec_IntPop(pVVar1);
    for (i_01 = 0; i_01 < pVVar1->nSize; i_01 = i_01 + 1) {
      i = Vec_IntEntry(pVVar1,i_01);
      p_02 = (Vec_Int_t *)Vec_PtrEntry(p_01,i);
      Vec_IntPush(p_02,Entry);
    }
  }
  Vec_VecFree((Vec_Vec_t *)p_00);
  return p_01;
}

Assistant:

Vec_Ptr_t * Aig_ManSupportsInverse( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupps, * vSuppsInv;
    Vec_Int_t * vSupp;
    int i, k, iIn, iOut;
    // get structural supports for each output
    vSupps = Aig_ManSupports( p );
    // start the inverse supports
    vSuppsInv = Vec_PtrAlloc( Aig_ManCiNum(p) );
    for ( i = 0; i < Aig_ManCiNum(p); i++ )
        Vec_PtrPush( vSuppsInv, Vec_IntAlloc(8) );
    // transforms the supports into the inverse supports
    Vec_PtrForEachEntry( Vec_Int_t *, vSupps, vSupp, i )
    {
        iOut = Vec_IntPop( vSupp );
        Vec_IntForEachEntry( vSupp, iIn, k )
            Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(vSuppsInv, iIn), iOut );
    }
    Vec_VecFree( (Vec_Vec_t *)vSupps );
    return vSuppsInv;
}